

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O1

size_t cali_channel_pull_snapshot(cali_id_t chn_id,int param_2,size_t len,uchar *buf)

{
  bool bVar1;
  int iVar2;
  CompressedSnapshotRecord *this;
  ostream *poVar3;
  Channel channel;
  Caliper c;
  CompressedSnapshotRecord rec;
  FixedSizeSnapshotRecord<120UL> snapshot;
  undefined1 local_df0 [48];
  CompressedSnapshotRecord local_dc0;
  Entry local_b80 [120];
  SnapshotBuilder local_40;
  
  cali::Caliper::sigsafe_instance();
  bVar1 = cali::Caliper::operator_cast_to_bool((Caliper *)(local_df0 + 0x10));
  if (bVar1) {
    memset(local_b80,0,0xb40);
    local_40.m_capacity = 0x78;
    local_40.m_len = 0;
    local_40.m_skipped = 0;
    local_40.m_data = local_b80;
    cali::Caliper::get_channel((Caliper *)local_df0,(cali_id_t)(local_df0 + 0x10));
    if (((GlobalData *)local_df0._8_8_ == (GlobalData *)0x0) ||
       (*(_Atomic_word *)(local_df0._8_8_ + 8) < 1)) {
      this = &local_dc0;
      std::ofstream::ofstream(this);
      local_dc0.m_buffer._0_4_ = 0;
      iVar2 = cali::Log::verbosity();
      if ((int)local_dc0.m_buffer <= iVar2) {
        this = (CompressedSnapshotRecord *)cali::Log::get_stream((Log *)&local_dc0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,"cali_channel_pull_snapshot(): invalid channel id ",0x31);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)this);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_dc0.m_internal_buffer[0] = std::ofstream::VTT;
      local_dc0.m_internal_buffer[1] = std::ofstream::VTT_1;
      local_dc0.m_internal_buffer[2] = uRam000000000028523a;
      local_dc0.m_internal_buffer[3] = uRam000000000028523b;
      local_dc0.m_internal_buffer[4] = uRam000000000028523c;
      local_dc0.m_internal_buffer[5] = uRam000000000028523d;
      local_dc0.m_internal_buffer[6] = uRam000000000028523e;
      local_dc0.m_internal_buffer[7] = uRam000000000028523f;
      *(undefined8 *)(local_dc0.m_internal_buffer + *(long *)(_VTT + -0x18)) =
           ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)(local_dc0.m_internal_buffer + 8));
      std::ios_base::~ios_base((ios_base *)(local_dc0.m_internal_buffer + 0xf8));
    }
    else {
      cali::Caliper::pull_snapshot
                ((Caliper *)(local_df0 + 0x10),(ChannelBody *)local_df0._0_8_,
                 (SnapshotView)ZEXT816(0),&local_40);
    }
    cali::CompressedSnapshotRecord::CompressedSnapshotRecord(&local_dc0,len,buf);
    cali::CompressedSnapshotRecord::append(&local_dc0,local_40.m_len,local_40.m_data);
    cali::CompressedSnapshotRecord::~CompressedSnapshotRecord(&local_dc0);
    cali::Channel::~Channel((Channel *)local_df0);
  }
  else {
    local_dc0.m_needed_len = 0;
  }
  return local_dc0.m_needed_len;
}

Assistant:

size_t cali_channel_pull_snapshot(cali_id_t chn_id, int /* scopes */, size_t len, unsigned char* buf)
{
    Caliper c = Caliper::sigsafe_instance();

    if (!c)
        return 0;

    FixedSizeSnapshotRecord<SNAP_MAX> snapshot;
    Channel                           channel = c.get_channel(chn_id);

    if (channel)
        c.pull_snapshot(channel.body(), SnapshotView(), snapshot.builder());
    else
        Log(0).stream() << "cali_channel_pull_snapshot(): invalid channel id " << chn_id << std::endl;

    CompressedSnapshotRecord rec(len, buf);
    SnapshotView             view(snapshot.view());
    rec.append(view.size(), view.data());

    return rec.needed_len();
}